

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
          (any *this,numeric *args,numeric *args_1,numeric *args_2)

{
  proxy *ppVar1;
  int local_28 [2];
  holder<cs::range_type> *local_20;
  
  local_28[1] = 2;
  local_28[0] = 1;
  local_20 = cs::
             allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
                       ((allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::range_type>::allocator,args,args_1,args_2);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<cs::range_type>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,local_28 + 1,local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}